

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,float>
               (char *input_str,float *result)

{
  string_t input_00;
  bool bVar1;
  string_t input;
  undefined1 in_stack_ffffffffffffffcf;
  char *in_stack_ffffffffffffffd8;
  string_t *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  string_t::string_t(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  input_00.value.pointer.ptr = (char *)in_stack_ffffffffffffffe0;
  input_00.value._0_8_ = local_18;
  bVar1 = TryCast::Operation<duckdb::string_t,float>
                    (input_00,(float *)in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffcf);
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}